

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_NoPeerCertificate_Test::~SSLVersionTest_NoPeerCertificate_Test
          (SSLVersionTest_NoPeerCertificate_Test *this)

{
  (this->super_SSLVersionTest).super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>.
  super_Test._vptr_Test = (_func_int **)&PTR__SSLVersionTest_00429750;
  (this->super_SSLVersionTest).super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>.
  super_WithParamInterface<bssl::(anonymous_namespace)::VersionParam>._vptr_WithParamInterface =
       (_func_int **)&PTR__SSLVersionTest_00429790;
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).key_);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).cert_);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).client_ctx_);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).server_ctx_);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).server_);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).client_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TEST_P(SSLVersionTest, NoPeerCertificate) {
  SSL_CTX_set_verify(server_ctx_.get(), SSL_VERIFY_PEER, nullptr);
  SSL_CTX_set_cert_verify_callback(server_ctx_.get(), VerifySucceed, NULL);
  SSL_CTX_set_cert_verify_callback(client_ctx_.get(), VerifySucceed, NULL);

  ASSERT_TRUE(Connect());

  // Server should not see a peer certificate.
  bssl::UniquePtr<X509> peer(SSL_get_peer_certificate(server_.get()));
  ASSERT_FALSE(peer);
  ASSERT_FALSE(SSL_get0_peer_certificates(server_.get()));
}